

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O0

Type * __thiscall soul::AST::Constant::getResultType(Type *__return_storage_ptr__,Constant *this)

{
  Type *pTVar1;
  Constant *this_local;
  
  pTVar1 = soul::Value::getType(&this->value);
  Type::Type(__return_storage_ptr__,pTVar1);
  return __return_storage_ptr__;
}

Assistant:

Type getResultType() const override                 { return value.getType(); }